

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O0

Error __thiscall asmjit::v1_14::CodeHolder::newLabelEntry(CodeHolder *this,LabelEntry **entryOut)

{
  LabelEntry *this_00;
  ZoneVector<asmjit::v1_14::LabelEntry_*> *in_RSI;
  LabelEntry **in_RDI;
  LabelEntry *le;
  Error _err;
  uint32_t labelId;
  ZoneAllocator *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar1;
  Error local_1c;
  
  *(undefined8 *)in_RSI = 0;
  iVar1 = *(int *)(in_RDI + 0x20);
  if (iVar1 == -1) {
    local_1c = DebugUtils::errored(0xd);
  }
  else {
    local_1c = ZoneVector<asmjit::v1_14::LabelEntry_*>::willGrow
                         (in_RSI,(ZoneAllocator *)CONCAT44(iVar1,in_stack_ffffffffffffffc8),
                          (uint32_t)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
    if (local_1c == 0) {
      this_00 = ZoneAllocator::allocZeroedT<asmjit::v1_14::LabelEntry>
                          (in_stack_ffffffffffffffc0,(size_t)in_RDI);
      if (this_00 == (LabelEntry *)0x0) {
        local_1c = DebugUtils::errored(1);
      }
      else {
        *(int *)&this_00->field_0xc = iVar1;
        this_00->_parentId = 0xffffffff;
        this_00->_offset = 0;
        ZoneVector<asmjit::v1_14::LabelEntry_*>::appendUnsafe
                  ((ZoneVector<asmjit::v1_14::LabelEntry_*> *)this_00,in_RDI);
        *(LabelEntry **)in_RSI = this_00;
        local_1c = 0;
      }
    }
  }
  return local_1c;
}

Assistant:

Error CodeHolder::newLabelEntry(LabelEntry** entryOut) noexcept {
  *entryOut = nullptr;

  uint32_t labelId = _labelEntries.size();
  if (ASMJIT_UNLIKELY(labelId == Globals::kInvalidId))
    return DebugUtils::errored(kErrorTooManyLabels);

  ASMJIT_PROPAGATE(_labelEntries.willGrow(&_allocator));
  LabelEntry* le = _allocator.allocZeroedT<LabelEntry>();

  if (ASMJIT_UNLIKELY(!le))
    return DebugUtils::errored(kErrorOutOfMemory);

  le->_setId(labelId);
  le->_parentId = Globals::kInvalidId;
  le->_offset = 0;
  _labelEntries.appendUnsafe(le);

  *entryOut = le;
  return kErrorOk;
}